

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

gzFile gz_open(char *path,int fd,char *mode)

{
  size_t sVar1;
  char *pcVar2;
  __off_t _Var3;
  uint local_4c;
  int local_3c;
  gz_statep state;
  char *mode_local;
  int fd_local;
  char *path_local;
  
  path_local = (char *)malloc(0xe8);
  if ((gz_statep)path_local == (gz_statep)0x0) {
    path_local = (char *)0x0;
  }
  else {
    ((gz_statep)path_local)->size = 0;
    ((gz_statep)path_local)->want = 0x2000;
    ((gz_statep)path_local)->msg = (char *)0x0;
    ((gz_statep)path_local)->mode = 0;
    ((gz_statep)path_local)->level = -1;
    ((gz_statep)path_local)->strategy = 0;
    for (state = (gz_statep)mode; (char)state->mode != '\0';
        state = (gz_statep)((long)&state->mode + 1)) {
      if (((char)state->mode < '0') || ('9' < (char)state->mode)) {
        switch((char)state->mode) {
        case '+':
          free(path_local);
          return (gzFile)0x0;
        case 'F':
          ((gz_statep)path_local)->strategy = 4;
        default:
          break;
        case 'R':
          ((gz_statep)path_local)->strategy = 3;
          break;
        case 'a':
          ((gz_statep)path_local)->mode = 1;
          break;
        case 'b':
          break;
        case 'f':
          ((gz_statep)path_local)->strategy = 1;
          break;
        case 'h':
          ((gz_statep)path_local)->strategy = 2;
          break;
        case 'r':
          ((gz_statep)path_local)->mode = 0x1c4f;
          break;
        case 'w':
          ((gz_statep)path_local)->mode = 0x79b1;
        }
      }
      else {
        ((gz_statep)path_local)->level = (char)state->mode + -0x30;
      }
    }
    if (((gz_statep)path_local)->mode == 0) {
      free(path_local);
      path_local = (char *)0x0;
    }
    else {
      sVar1 = strlen(path);
      pcVar2 = (char *)malloc(sVar1 + 1);
      ((gz_statep)path_local)->path = pcVar2;
      if (((gz_statep)path_local)->path == (char *)0x0) {
        free(path_local);
        path_local = (char *)0x0;
      }
      else {
        strcpy(((gz_statep)path_local)->path,path);
        local_3c = fd;
        if (fd == -1) {
          if (((gz_statep)path_local)->mode == 0x1c4f) {
            local_4c = 0;
          }
          else {
            local_4c = 0x400;
            if (((gz_statep)path_local)->mode == 0x79b1) {
              local_4c = 0x200;
            }
            local_4c = local_4c | 0x41;
          }
          local_3c = open(path,local_4c,0x1b6);
        }
        ((gz_statep)path_local)->fd = local_3c;
        if (((gz_statep)path_local)->fd == -1) {
          free(((gz_statep)path_local)->path);
          free(path_local);
          path_local = (char *)0x0;
        }
        else {
          if (((gz_statep)path_local)->mode == 1) {
            ((gz_statep)path_local)->mode = 0x79b1;
          }
          if (((gz_statep)path_local)->mode == 0x1c4f) {
            _Var3 = lseek(((gz_statep)path_local)->fd,0,1);
            ((gz_statep)path_local)->start = _Var3;
            if (((gz_statep)path_local)->start == -1) {
              ((gz_statep)path_local)->start = 0;
            }
          }
          gz_reset((gz_statep)path_local);
        }
      }
    }
  }
  return path_local;
}

Assistant:

local gzFile gz_open(const char *path, int fd, const char *mode)
{
    gz_statep state;

    /* allocate gzFile structure to return */
    state = (gz_statep)malloc(sizeof(gz_state));
    if (state == NULL)
        return NULL;
    state->size = 0;            /* no buffers allocated yet */
    state->want = GZBUFSIZE;    /* requested buffer size */
    state->msg = NULL;          /* no error message yet */

    /* interpret mode */
    state->mode = GZ_NONE;
    state->level = Z_DEFAULT_COMPRESSION;
    state->strategy = Z_DEFAULT_STRATEGY;
    while (*mode) {
        if (*mode >= '0' && *mode <= '9')
            state->level = *mode - '0';
        else
            switch (*mode) {
            case 'r':
                state->mode = GZ_READ;
                break;
#ifndef NO_GZCOMPRESS
            case 'w':
                state->mode = GZ_WRITE;
                break;
            case 'a':
                state->mode = GZ_APPEND;
                break;
#endif
            case '+':       /* can't read and write at the same time */
                free(state);
                return NULL;
            case 'b':       /* ignore -- will request binary anyway */
                break;
            case 'f':
                state->strategy = Z_FILTERED;
                break;
            case 'h':
                state->strategy = Z_HUFFMAN_ONLY;
                break;
            case 'R':
                state->strategy = Z_RLE;
                break;
            case 'F':
                state->strategy = Z_FIXED;
            default:        /* could consider as an error, but just ignore */
                ;
            }
        mode++;
    }

    /* must provide an "r", "w", or "a" */
    if (state->mode == GZ_NONE) {
        free(state);
        return NULL;
    }

    /* save the path name for error messages */
    state->path = (char *)malloc(strlen(path) + 1);
    if (state->path == NULL) {
        free(state);
        return NULL;
    }
    strcpy(state->path, path);

    /* open the file with the appropriate mode (or just use fd) */
    state->fd = fd != -1 ? fd :
        open(path,
#ifdef O_LARGEFILE
            O_LARGEFILE |
#endif
#ifdef O_BINARY
            O_BINARY |
#endif
            (state->mode == GZ_READ ?
                O_RDONLY :
                (O_WRONLY | O_CREAT | (
                    state->mode == GZ_WRITE ?
                        O_TRUNC :
                        O_APPEND))),
            0666);
    if (state->fd == -1) {
        free(state->path);
        free(state);
        return NULL;
    }
    if (state->mode == GZ_APPEND)
        state->mode = GZ_WRITE;         /* simplify later checks */

    /* save the current position for rewinding (only if reading) */
    if (state->mode == GZ_READ) {
        state->start = LSEEK(state->fd, 0, SEEK_CUR);
        if (state->start == -1) state->start = 0;
    }

    /* initialize stream */
    gz_reset(state);

    /* return stream */
    return (gzFile)state;
}